

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteDouble(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this,double d)

{
  char *buffer;
  char *pcVar1;
  
  if ((ulong)ABS(d) < 0x7ff0000000000000) {
    buffer = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->os_->stack_,0x19);
    pcVar1 = internal::dtoa(d,buffer,this->maxDecimalPlaces_);
    internal::Stack<rapidjson::CrtAllocator>::Pop<char>
              (&this->os_->stack_,(size_t)(buffer + (0x19 - (long)pcVar1)));
  }
  else {
    internal::Stack<rapidjson::CrtAllocator>::Reserve<char>(&this->os_->stack_,3);
    GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PutUnsafe(this->os_,'0');
    GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PutUnsafe(this->os_,'.');
    GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PutUnsafe(this->os_,'0');
  }
  return (ulong)ABS(d) < 0x7ff0000000000000;
}

Assistant:

inline bool Writer<StringBuffer>::WriteDouble(double d) {
    if (internal::Double(d).IsNanOrInf()) {
        // Note: This code path can only be reached if (RAPIDJSON_WRITE_DEFAULT_FLAGS & kWriteNanAndInfFlag).
		if (!(kWriteDefaultFlags & kWriteNanAndInfFlag))
		{
			// At least ensure that the output does not get broken.
			PutReserve(*os_, 3);
			PutUnsafe(*os_, '0');
			PutUnsafe(*os_, '.');
			PutUnsafe(*os_, '0');
			return false;
		}
        if (internal::Double(d).IsNan()) {
            PutReserve(*os_, 3);
            PutUnsafe(*os_, 'N'); PutUnsafe(*os_, 'a'); PutUnsafe(*os_, 'N');
            return true;
        }
        if (internal::Double(d).Sign()) {
            PutReserve(*os_, 9);
            PutUnsafe(*os_, '-');
        }
        else
            PutReserve(*os_, 8);
        PutUnsafe(*os_, 'I'); PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'f');
        PutUnsafe(*os_, 'i'); PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'i'); PutUnsafe(*os_, 't'); PutUnsafe(*os_, 'y');
        return true;
    }
    
    char *buffer = os_->Push(25);
    char* end = internal::dtoa(d, buffer, maxDecimalPlaces_);
    os_->Pop(static_cast<size_t>(25 - (end - buffer)));
    return true;
}